

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O3

void __thiscall Assimp::B3DImporter::ReadTRIS(B3DImporter *this,int v0)

{
  int iVar1;
  int iVar2;
  int iVar3;
  tuple<aiMesh_*,_std::default_delete<aiMesh>_> tVar4;
  ulong *puVar5;
  ulong *puVar6;
  int *piVar7;
  uint uVar8;
  B3DImporter *pBVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  unique_ptr<aiMesh,_std::default_delete<aiMesh>_> mesh;
  __uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_> local_78;
  undefined1 local_70 [32];
  _Base_ptr local_50;
  
  iVar1 = ReadInt(this);
  iVar2 = 0;
  if ((iVar1 != -1) &&
     ((iVar1 < 0 ||
      (iVar2 = iVar1,
      (int)((ulong)((long)(this->_materials).
                          super__Vector_base<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>,_std::allocator<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->_materials).
                         super__Vector_base<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>,_std::allocator<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3) <= iVar1)))) {
    local_50 = (_Base_ptr)&stack0xffffffffffffffc0;
    pBVar9 = (B3DImporter *)&stack0xffffffffffffffb0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xffffffffffffffb0,"Bad material id","");
    Fail(pBVar9,(string *)&stack0xffffffffffffffb0);
  }
  tVar4.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>)operator_new(0x520);
  *(undefined4 *)
   ((long)tVar4.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
          super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 4) = 0;
  memset((undefined4 *)
         ((long)tVar4.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x10),0,0xcc);
  *(undefined8 *)
   ((long)tVar4.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
          super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xe0) = 0;
  *(undefined8 *)
   ((long)tVar4.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
          super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xe8) = 0;
  *(undefined1 *)
   ((long)tVar4.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
          super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xf0) = 0;
  memset((void *)((long)tVar4.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                        super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xf1),0x1b,0x3ff);
  *(undefined4 *)
   ((long)tVar4.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
          super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x4f0) = 0;
  *(undefined8 *)
   ((long)tVar4.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
          super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x4f8) = 0;
  *(undefined8 *)
   ((long)tVar4.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
          super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x500) = 0;
  *(undefined8 *)
   ((long)tVar4.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
          super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x508) = 0;
  *(undefined8 *)
   ((long)tVar4.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
          super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x510) = 0;
  *(undefined4 *)
   ((long)tVar4.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
          super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x518) = 0;
  memset((undefined4 *)
         ((long)tVar4.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x30),0,0xa0);
  *(int *)((long)tVar4.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                 super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xe8) = iVar2;
  *(undefined4 *)
   ((long)tVar4.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
          super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 8) = 0;
  *(undefined4 *)
   tVar4.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
   super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl = 4;
  uVar12 = (this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish[-1] - this->_pos;
  uVar11 = (ulong)uVar12 / 0xc;
  local_78._M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl =
       (tuple<aiMesh_*,_std::default_delete<aiMesh>_>)
       (tuple<aiMesh_*,_std::default_delete<aiMesh>_>)
       tVar4.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
       super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl;
  puVar5 = (ulong *)operator_new__(uVar11 * 0x10 + 8);
  *puVar5 = uVar11;
  puVar5 = puVar5 + 1;
  if (uVar12 < 0xc) {
    *(ulong **)
     ((long)tVar4.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
            super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xd0) = puVar5;
  }
  else {
    puVar6 = puVar5;
    do {
      *(undefined4 *)puVar6 = 0;
      puVar6[1] = 0;
      puVar6 = puVar6 + 2;
    } while (puVar6 != puVar5 + uVar11 * 2);
    *(ulong **)
     ((long)tVar4.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
            super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xd0) = puVar5;
    if (0xb < uVar12) {
      uVar8 = 1;
      if (1 < uVar12 / 0xc) {
        uVar8 = uVar12 / 0xc;
      }
      do {
        iVar2 = ReadInt(this);
        iVar1 = ReadInt(this);
        iVar3 = ReadInt(this);
        iVar2 = iVar2 + v0;
        if ((((iVar2 < 0) ||
             (uVar12 = (int)((ulong)((long)(this->_vertices).
                                           super__Vector_base<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->_vertices).
                                          super__Vector_base<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                       -0x49249249, (int)uVar12 <= iVar2)) || (uVar10 = iVar1 + v0, (int)uVar10 < 0)
            ) || (((uVar12 <= uVar10 || (uVar13 = iVar3 + v0, (int)uVar13 < 0)) ||
                  (uVar12 <= uVar13)))) {
          local_70._0_8_ = local_70 + 0x10;
          pBVar9 = (B3DImporter *)local_70;
          std::__cxx11::string::_M_construct<char_const*>((string *)pBVar9,"Bad triangle index","");
          Fail(pBVar9,(string *)local_70);
        }
        *(undefined4 *)puVar5 = 3;
        piVar7 = (int *)operator_new__(0xc);
        puVar5[1] = (ulong)piVar7;
        *piVar7 = iVar2;
        piVar7[1] = uVar10;
        piVar7[2] = uVar13;
        *(uint *)((long)local_78._M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>
                        .super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 8) =
             *(uint *)((long)local_78._M_t.
                             super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                             super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 8) + 1;
        puVar5 = puVar5 + 2;
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
    }
  }
  std::
  vector<std::unique_ptr<aiMesh,std::default_delete<aiMesh>>,std::allocator<std::unique_ptr<aiMesh,std::default_delete<aiMesh>>>>
  ::emplace_back<std::unique_ptr<aiMesh,std::default_delete<aiMesh>>>
            ((vector<std::unique_ptr<aiMesh,std::default_delete<aiMesh>>,std::allocator<std::unique_ptr<aiMesh,std::default_delete<aiMesh>>>>
              *)&this->_meshes,(unique_ptr<aiMesh,_std::default_delete<aiMesh>_> *)&local_78);
  std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::~unique_ptr
            ((unique_ptr<aiMesh,_std::default_delete<aiMesh>_> *)&local_78);
  return;
}

Assistant:

void B3DImporter::ReadTRIS(int v0) {
	int matid = ReadInt();
	if (matid == -1) {
		matid = 0;
	} else if (matid < 0 || matid >= (int)_materials.size()) {
#ifdef DEBUG_B3D
		ASSIMP_LOG_ERROR_F("material id=", matid);
#endif
		Fail("Bad material id");
	}

	std::unique_ptr<aiMesh> mesh(new aiMesh);

	mesh->mMaterialIndex = matid;
	mesh->mNumFaces = 0;
	mesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

	int n_tris = ChunkSize() / 12;
	aiFace *face = mesh->mFaces = new aiFace[n_tris];

	for (int i = 0; i < n_tris; ++i) {
		int i0 = ReadInt() + v0;
		int i1 = ReadInt() + v0;
		int i2 = ReadInt() + v0;
		if (i0 < 0 || i0 >= (int)_vertices.size() || i1 < 0 || i1 >= (int)_vertices.size() || i2 < 0 || i2 >= (int)_vertices.size()) {
#ifdef DEBUG_B3D
			ASSIMP_LOG_ERROR_F("Bad triangle index: i0=", i0, ", i1=", i1, ", i2=", i2);
#endif
			Fail("Bad triangle index");
			continue;
		}
		face->mNumIndices = 3;
		face->mIndices = new unsigned[3];
		face->mIndices[0] = i0;
		face->mIndices[1] = i1;
		face->mIndices[2] = i2;
		++mesh->mNumFaces;
		++face;
	}

	_meshes.emplace_back(std::move(mesh));
}